

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_7zip_empty.c
# Opt level: O0

void test_only_empty_files(void)

{
  int iVar1;
  mode_t mVar2;
  time_t tVar3;
  long lVar4;
  char *pcVar5;
  la_int64_t lVar6;
  size_t local_30;
  size_t used;
  char *buff;
  size_t buffsize;
  archive_entry *ae;
  archive *a;
  
  buff = (char *)0x3e8;
  used = (size_t)malloc(1000);
  ae = (archive_entry *)archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                   ,L'©',(uint)(ae != (archive_entry *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_7zip((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'ª',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_7zip(a)",ae);
  iVar1 = archive_write_add_filter_none((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'«',0,"ARCHIVE_OK",(long)iVar1,"archive_write_add_filter_none(a)",ae);
  iVar1 = archive_write_open_memory((archive *)ae,(void *)used,(size_t)buff,&local_30);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'­',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_open_memory(a, buff, buffsize, &used)",ae);
  buffsize = (size_t)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                   ,L'²',(uint)((archive_entry *)buffsize != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime((archive_entry *)buffsize,1,10);
  tVar3 = archive_entry_mtime((archive_entry *)buffsize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'´',1,"1",tVar3,"archive_entry_mtime(ae)",(void *)0x0);
  lVar4 = archive_entry_mtime_nsec((archive_entry *)buffsize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'µ',10,"10",lVar4,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  archive_entry_set_atime((archive_entry *)buffsize,2,0x14);
  tVar3 = archive_entry_atime((archive_entry *)buffsize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'·',2,"2",tVar3,"archive_entry_atime(ae)",(void *)0x0);
  lVar4 = archive_entry_atime_nsec((archive_entry *)buffsize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'¸',0x14,"20",lVar4,"archive_entry_atime_nsec(ae)",(void *)0x0);
  archive_entry_copy_pathname((archive_entry *)buffsize,"empty");
  pcVar5 = archive_entry_pathname((archive_entry *)buffsize);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
             ,L'º',"empty","\"empty\"",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  archive_entry_set_mode((archive_entry *)buffsize,0x81ed);
  mVar2 = archive_entry_mode((archive_entry *)buffsize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'¼',0x81ed,"(AE_IFREG | 0755)",(ulong)mVar2,"archive_entry_mode(ae)",
                      (void *)0x0);
  iVar1 = archive_write_header((archive *)ae,(archive_entry *)buffsize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'¾',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",(void *)0x0);
  archive_entry_free((archive_entry *)buffsize);
  buffsize = (size_t)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                   ,L'Ä',(uint)((archive_entry *)buffsize != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime((archive_entry *)buffsize,2,10);
  tVar3 = archive_entry_mtime((archive_entry *)buffsize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'Æ',2,"2",tVar3,"archive_entry_mtime(ae)",(void *)0x0);
  lVar4 = archive_entry_mtime_nsec((archive_entry *)buffsize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'Ç',10,"10",lVar4,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  archive_entry_set_ctime((archive_entry *)buffsize,2,10);
  tVar3 = archive_entry_ctime((archive_entry *)buffsize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'É',2,"2",tVar3,"archive_entry_ctime(ae)",(void *)0x0);
  lVar4 = archive_entry_ctime_nsec((archive_entry *)buffsize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'Ê',10,"10",lVar4,"archive_entry_ctime_nsec(ae)",(void *)0x0);
  archive_entry_copy_pathname((archive_entry *)buffsize,"empty2");
  pcVar5 = archive_entry_pathname((archive_entry *)buffsize);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
             ,L'Ì',"empty2","\"empty2\"",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  archive_entry_set_mode((archive_entry *)buffsize,0x81a4);
  mVar2 = archive_entry_mode((archive_entry *)buffsize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'Î',0x81a4,"(AE_IFREG | 0644)",(ulong)mVar2,"archive_entry_mode(ae)",
                      (void *)0x0);
  iVar1 = archive_write_header((archive *)ae,(archive_entry *)buffsize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'Ð',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",(void *)0x0);
  archive_entry_free((archive_entry *)buffsize);
  buffsize = (size_t)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                   ,L'Ö',(uint)((archive_entry *)buffsize != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime((archive_entry *)buffsize,3,10);
  tVar3 = archive_entry_mtime((archive_entry *)buffsize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'Ø',3,"3",tVar3,"archive_entry_mtime(ae)",(void *)0x0);
  lVar4 = archive_entry_mtime_nsec((archive_entry *)buffsize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'Ù',10,"10",lVar4,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  archive_entry_copy_pathname((archive_entry *)buffsize,"empty3");
  pcVar5 = archive_entry_pathname((archive_entry *)buffsize);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
             ,L'Û',"empty3","\"empty3\"",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  archive_entry_set_mode((archive_entry *)buffsize,0x81a4);
  mVar2 = archive_entry_mode((archive_entry *)buffsize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'Ý',0x81a4,"(AE_IFREG | 0644)",(ulong)mVar2,"archive_entry_mode(ae)",
                      (void *)0x0);
  iVar1 = archive_write_header((archive *)ae,(archive_entry *)buffsize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'ß',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",(void *)0x0);
  archive_entry_free((archive_entry *)buffsize);
  iVar1 = archive_write_close((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'ã',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",(void *)0x0);
  iVar1 = archive_write_free((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'ä',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'ç',(void *)used,"buff",anon_var_dwarf_42eaa,
                      "\"\\x37\\x7a\\xbc\\xaf\\x27\\x1c\\x00\\x03\"",8,"8",(void *)0x0);
  ae = (archive_entry *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                   ,L'í',(uint)(ae != (archive_entry *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_format_all((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'î',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",ae);
  iVar1 = archive_read_support_filter_all((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'ï',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",ae);
  iVar1 = read_open_memory_seek((archive *)ae,(void *)used,local_30,7);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'ð',0,"ARCHIVE_OK",(long)iVar1,"read_open_memory_seek(a, buff, used, 7)",ae
                     );
  iVar1 = archive_read_next_header((archive *)ae,(archive_entry **)&buffsize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'õ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",ae);
  tVar3 = archive_entry_mtime((archive_entry *)buffsize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'ö',1,"1",tVar3,"archive_entry_mtime(ae)",(void *)0x0);
  lVar4 = archive_entry_mtime_nsec((archive_entry *)buffsize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'÷',0,"0",lVar4,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar3 = archive_entry_atime((archive_entry *)buffsize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'ø',2,"2",tVar3,"archive_entry_atime(ae)",(void *)0x0);
  lVar4 = archive_entry_atime_nsec((archive_entry *)buffsize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'ù',0,"0",lVar4,"archive_entry_atime_nsec(ae)",(void *)0x0);
  tVar3 = archive_entry_ctime((archive_entry *)buffsize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'ú',0,"0",tVar3,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar5 = archive_entry_pathname((archive_entry *)buffsize);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
             ,L'û',"empty","\"empty\"",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar2 = archive_entry_mode((archive_entry *)buffsize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'ü',0x81ed,"AE_IFREG | 0755",(ulong)mVar2,"archive_entry_mode(ae)",
                      (void *)0x0);
  lVar6 = archive_entry_size((archive_entry *)buffsize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'ý',0,"0",lVar6,"archive_entry_size(ae)",(void *)0x0);
  iVar1 = archive_read_next_header((archive *)ae,(archive_entry **)&buffsize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'Ă',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",ae);
  tVar3 = archive_entry_mtime((archive_entry *)buffsize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'ă',2,"2",tVar3,"archive_entry_mtime(ae)",(void *)0x0);
  lVar4 = archive_entry_mtime_nsec((archive_entry *)buffsize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'Ą',0,"0",lVar4,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar3 = archive_entry_atime((archive_entry *)buffsize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'ą',0,"0",tVar3,"archive_entry_atime(ae)",(void *)0x0);
  tVar3 = archive_entry_ctime((archive_entry *)buffsize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'Ć',2,"2",tVar3,"archive_entry_ctime(ae)",(void *)0x0);
  lVar4 = archive_entry_ctime_nsec((archive_entry *)buffsize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'ć',0,"0",lVar4,"archive_entry_ctime_nsec(ae)",(void *)0x0);
  pcVar5 = archive_entry_pathname((archive_entry *)buffsize);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
             ,L'Ĉ',"empty2","\"empty2\"",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar2 = archive_entry_mode((archive_entry *)buffsize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'ĉ',0x81a4,"AE_IFREG | 0644",(ulong)mVar2,"archive_entry_mode(ae)",
                      (void *)0x0);
  lVar6 = archive_entry_size((archive_entry *)buffsize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'Ċ',0,"0",lVar6,"archive_entry_size(ae)",(void *)0x0);
  iVar1 = archive_read_next_header((archive *)ae,(archive_entry **)&buffsize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'ď',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",ae);
  tVar3 = archive_entry_mtime((archive_entry *)buffsize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'Đ',3,"3",tVar3,"archive_entry_mtime(ae)",(void *)0x0);
  lVar4 = archive_entry_mtime_nsec((archive_entry *)buffsize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'đ',0,"0",lVar4,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar3 = archive_entry_atime((archive_entry *)buffsize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'Ē',0,"0",tVar3,"archive_entry_atime(ae)",(void *)0x0);
  tVar3 = archive_entry_ctime((archive_entry *)buffsize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'ē',0,"0",tVar3,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar5 = archive_entry_pathname((archive_entry *)buffsize);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
             ,L'Ĕ',"empty3","\"empty3\"",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar2 = archive_entry_mode((archive_entry *)buffsize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'ĕ',0x81a4,"AE_IFREG | 0644",(ulong)mVar2,"archive_entry_mode(ae)",
                      (void *)0x0);
  lVar6 = archive_entry_size((archive_entry *)buffsize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'Ė',0,"0",lVar6,"archive_entry_size(ae)",(void *)0x0);
  iVar1 = archive_read_next_header((archive *)ae,(archive_entry **)&buffsize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'ę',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",ae);
  iVar1 = archive_filter_code((archive *)ae,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'Ĝ',0,"ARCHIVE_FILTER_NONE",(long)iVar1,"archive_filter_code(a, 0)",ae);
  iVar1 = archive_format((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'ĝ',0xe0000,"ARCHIVE_FORMAT_7ZIP",(long)iVar1,"archive_format(a)",ae);
  iVar1 = archive_read_close((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'ğ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
  iVar1 = archive_read_free((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_7zip_empty.c"
                      ,L'Ġ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  free((void *)used);
  return;
}

Assistant:

static void
test_only_empty_files(void)
{
	struct archive *a;
	struct archive_entry *ae;
	size_t buffsize = 1000;
	char *buff;
	size_t used;

	buff = malloc(buffsize);

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_7zip(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_none(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used));

	/*
	 * Write an empty file to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 1, 10);
	assertEqualInt(1, archive_entry_mtime(ae));
	assertEqualInt(10, archive_entry_mtime_nsec(ae));
	archive_entry_set_atime(ae, 2, 20);
	assertEqualInt(2, archive_entry_atime(ae));
	assertEqualInt(20, archive_entry_atime_nsec(ae));
	archive_entry_copy_pathname(ae, "empty");
	assertEqualString("empty", archive_entry_pathname(ae));
	archive_entry_set_mode(ae, AE_IFREG | 0755);
	assertEqualInt((AE_IFREG | 0755), archive_entry_mode(ae));

	assertEqualInt(ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);

	/*
	 * Write second empty file to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 2, 10);
	assertEqualInt(2, archive_entry_mtime(ae));
	assertEqualInt(10, archive_entry_mtime_nsec(ae));
	archive_entry_set_ctime(ae, 2, 10);
	assertEqualInt(2, archive_entry_ctime(ae));
	assertEqualInt(10, archive_entry_ctime_nsec(ae));
	archive_entry_copy_pathname(ae, "empty2");
	assertEqualString("empty2", archive_entry_pathname(ae));
	archive_entry_set_mode(ae, AE_IFREG | 0644);
	assertEqualInt((AE_IFREG | 0644), archive_entry_mode(ae));

	assertEqualInt(ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);

	/*
	 * Write third empty file to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 3, 10);
	assertEqualInt(3, archive_entry_mtime(ae));
	assertEqualInt(10, archive_entry_mtime_nsec(ae));
	archive_entry_copy_pathname(ae, "empty3");
	assertEqualString("empty3", archive_entry_pathname(ae));
	archive_entry_set_mode(ae, AE_IFREG | 0644);
	assertEqualInt((AE_IFREG | 0644), archive_entry_mode(ae));

	assertEqualInt(ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);

	/* Close out the archive. */
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* Verify the initial header. */
	assertEqualMem(buff, "\x37\x7a\xbc\xaf\x27\x1c\x00\x03", 8);

	/*
	 * Now, read the data back.
	 */
	/* With the test memory reader -- seeking mode. */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, read_open_memory_seek(a, buff, used, 7));

	/*
	 * Read and verify an empty file.
	 */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(1, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(2, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_atime_nsec(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("empty", archive_entry_pathname(ae));
	assertEqualInt(AE_IFREG | 0755, archive_entry_mode(ae));
	assertEqualInt(0, archive_entry_size(ae));

	/*
	 * Read and verify second empty file.
	 */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(2, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(2, archive_entry_ctime(ae));
	assertEqualInt(0, archive_entry_ctime_nsec(ae));
	assertEqualString("empty2", archive_entry_pathname(ae));
	assertEqualInt(AE_IFREG | 0644, archive_entry_mode(ae));
	assertEqualInt(0, archive_entry_size(ae));

	/*
	 * Read and verify third empty file.
	 */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(3, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("empty3", archive_entry_pathname(ae));
	assertEqualInt(AE_IFREG | 0644, archive_entry_mode(ae));
	assertEqualInt(0, archive_entry_size(ae));

	/* Verify the end of the archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify archive format. */
	assertEqualIntA(a, ARCHIVE_FILTER_NONE, archive_filter_code(a, 0));
	assertEqualIntA(a, ARCHIVE_FORMAT_7ZIP, archive_format(a));

	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	free(buff);
}